

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O2

ValidatorKeys *
jbcoin::ValidatorKeys::make_ValidatorKeys(ValidatorKeys *__return_storage_ptr__,path *keyFile)

{
  bool bVar1;
  KeyType KVar2;
  UInt tokenSequence;
  int iVar3;
  Value *pVVar4;
  reference_const_type secretKey;
  runtime_error *prVar5;
  long lVar6;
  Value jKeys;
  string local_3d0;
  optional<jbcoin::SecretKey> secret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  KeyType keyType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  Reader reader;
  ifstream ifsKeys;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifsKeys,(keyFile->m_pathname)._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(_ifsKeys + -0x18)] & 5) != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                   "Failed to open key file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
    std::runtime_error::runtime_error(prVar5,(string *)&reader);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Json::Reader::Reader(&reader);
  Json::Value::Value(&jKeys,nullValue);
  bVar1 = Json::Reader::parse(&reader,(istream *)&ifsKeys,&jKeys);
  if (!bVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secret,
                   "Unable to parse json key file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
    std::runtime_error::runtime_error(prVar5,(string *)&secret);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&make_ValidatorKeys(boost::filesystem::path_const&)::
                                 requiredFields_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_,
                 "key_type",(allocator *)&secret);
      std::__cxx11::string::string
                ((string *)
                 (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  _M_elems + 1),"secret_key",(allocator *)&local_3d0);
      std::__cxx11::string::string
                ((string *)
                 (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  _M_elems + 2),"token_sequence",(allocator *)&local_368);
      std::__cxx11::string::string
                ((string *)
                 (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  _M_elems + 3),"revoked",(allocator *)&local_388);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                   ::~array,&make_ValidatorKeys(boost::filesystem::path_const&)::
                             requiredFields_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&make_ValidatorKeys(boost::filesystem::path_const&)::
                           requiredFields_abi_cxx11_);
    }
  }
  for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 0x20) {
    std::__cxx11::string::string
              ((string *)&secret,
               (string *)
               ((long)&make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_
                       ._M_elems[0]._M_dataplus._M_p + lVar6));
    bVar1 = Json::Value::isMember(&jKeys,(string *)&secret);
    if (!bVar1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_340,"Key file \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
      std::operator+(&local_388,&local_340,"\' is missing \"");
      std::operator+(&local_368,&local_388,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secret);
      std::operator+(&local_3d0,&local_368,"\" field");
      std::runtime_error::runtime_error(prVar5,(string *)&local_3d0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string((string *)&secret);
  }
  pVVar4 = Json::Value::operator[](&jKeys,"key_type");
  Json::Value::asString_abi_cxx11_((string *)&secret,pVVar4);
  KVar2 = keyTypeFromString((string *)&secret);
  std::__cxx11::string::~string((string *)&secret);
  keyType = KVar2;
  if (KVar2 == invalid) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_368,"Key file \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
    std::operator+(&local_3d0,&local_368,"\' contains invalid \"key_type\" field: ");
    pVVar4 = Json::Value::operator[](&jKeys,"key_type");
    Json::Value::toStyledString_abi_cxx11_(&local_388,pVVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&secret,
                   &local_3d0,&local_388);
    std::runtime_error::runtime_error(prVar5,(string *)&secret);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVVar4 = Json::Value::operator[](&jKeys,"secret_key");
  Json::Value::asString_abi_cxx11_(&local_3d0,pVVar4);
  parseBase58<jbcoin::SecretKey>(&secret,TOKEN_NODE_PRIVATE,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  if (secret.super_type.m_initialized != false) {
    pVVar4 = Json::Value::operator[](&jKeys,"token_sequence");
    bVar1 = Json::Value::isIntegral(pVVar4);
    if (!bVar1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVVar4 = Json::Value::operator[](&jKeys,"token_sequence");
    tokenSequence = Json::Value::asUInt(pVVar4);
    pVVar4 = Json::Value::operator[](&jKeys,"revoked");
    bVar1 = Json::Value::isBool(pVVar4);
    if (bVar1) {
      secretKey = boost::optional<jbcoin::SecretKey>::get(&secret);
      pVVar4 = Json::Value::operator[](&jKeys,"revoked");
      bVar1 = Json::Value::asBool(pVVar4);
      ValidatorKeys(__return_storage_ptr__,&keyType,secretKey,tokenSequence,bVar1);
      boost::optional_detail::optional_base<jbcoin::SecretKey>::~optional_base(&secret.super_type);
      Json::Value::~Value(&jKeys);
      Json::Reader::~Reader(&reader);
      std::ifstream::~ifstream(&ifsKeys);
      return __return_storage_ptr__;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_388,"Key file \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
    std::operator+(&local_368,&local_388,"\' contains invalid \"revoked\" field: ");
    pVVar4 = Json::Value::operator[](&jKeys,"revoked");
    Json::Value::toStyledString_abi_cxx11_(&local_340,pVVar4);
    std::operator+(&local_3d0,&local_368,&local_340);
    std::runtime_error::runtime_error(prVar5,(string *)&local_3d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_388,"Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
  std::operator+(&local_368,&local_388,"\' contains invalid \"secret_key\" field: ");
  pVVar4 = Json::Value::operator[](&jKeys,"secret_key");
  Json::Value::toStyledString_abi_cxx11_(&local_340,pVVar4);
  std::operator+(&local_3d0,&local_368,&local_340);
  std::runtime_error::runtime_error(prVar5,(string *)&local_3d0);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ValidatorKeys
ValidatorKeys::make_ValidatorKeys (
    boost::filesystem::path const& keyFile)
{
    std::ifstream ifsKeys (keyFile.c_str (), std::ios::in);

    if (! ifsKeys)
        throw std::runtime_error (
            "Failed to open key file: " + keyFile.string());

    Json::Reader reader;
    Json::Value jKeys;
    if (! reader.parse (ifsKeys, jKeys))
    {
        throw std::runtime_error (
            "Unable to parse json key file: " + keyFile.string());
    }

    static std::array<std::string, 4> const requiredFields {{
        "key_type",
        "secret_key",
        "token_sequence",
        "revoked"
    }};

    for (auto field : requiredFields)
    {
        if (! jKeys.isMember(field))
        {
            throw std::runtime_error (
                "Key file '" + keyFile.string() +
                "' is missing \"" + field + "\" field");
        }
    }

    auto const keyType = keyTypeFromString (jKeys["key_type"].asString());
    if (keyType == KeyType::invalid)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"key_type\" field: " +
            jKeys["key_type"].toStyledString());
    }

    auto const secret = parseBase58<SecretKey> (
        TokenType::TOKEN_NODE_PRIVATE, jKeys["secret_key"].asString());

    if (! secret)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"secret_key\" field: " +
            jKeys["secret_key"].toStyledString());
    }

    std::uint32_t tokenSequence;
    try {
        if (! jKeys["token_sequence"].isIntegral())
            throw std::runtime_error ("");

        tokenSequence = jKeys["token_sequence"].asUInt();
    }
    catch (std::runtime_error&)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"token_sequence\" field: " +
            jKeys["token_sequence"].toStyledString());
    }

    if (! jKeys["revoked"].isBool())
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"revoked\" field: " +
            jKeys["revoked"].toStyledString());

    return ValidatorKeys (
        keyType, *secret, tokenSequence, jKeys["revoked"].asBool());
}